

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.cpp
# Opt level: O0

void __thiscall OpenMD::FragmentStamp::checkBends(FragmentStamp *this)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  size_type sVar5;
  ostream *poVar6;
  undefined8 uVar7;
  AtomStamp *this_00;
  reference piVar8;
  reference pvVar9;
  OpenMDException *this_01;
  string *msg;
  long in_RDI;
  pair<std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>,_bool> pVar10;
  type_conflict *third;
  type_conflict *second;
  type_conflict *first;
  tuple<int,_int,_int> bendTuple;
  iterator j_2;
  int ghostIndex_1;
  vector<int,_std::allocator<int>_> bend;
  BendStamp *bendStamp_2;
  size_t i_2;
  iterator iter;
  set<std::tuple<int,_int,_int>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
  allBends;
  int rigidbodyIndex;
  iterator j_1;
  vector<int,_std::allocator<int>_> rigidSet;
  vector<int,_std::allocator<int>_> bendAtoms_1;
  BendStamp *bendStamp_1;
  size_t i_1;
  size_t ghostIndex;
  iterator k;
  iterator j;
  vector<int,_std::allocator<int>_> bendAtoms;
  BendStamp *bendStamp;
  size_t i;
  ostringstream oss;
  undefined4 in_stack_fffffffffffff6e8;
  int in_stack_fffffffffffff6ec;
  _Rb_tree_const_iterator<std::tuple<int,_int,_int>_> in_stack_fffffffffffff6f0;
  string *in_stack_fffffffffffff6f8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff700;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff708;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff710;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff718;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff720;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff728;
  value_type_conflict1 *in_stack_fffffffffffff778;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff780;
  const_iterator in_stack_fffffffffffff788;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff790;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff898;
  bool local_6f1;
  string local_670 [32];
  string local_650 [32];
  _Self local_630;
  _Base_ptr local_628;
  __tuple_element_t<2UL,_tuple<int,_int,_int>_> *local_620;
  __tuple_element_t<1UL,_tuple<int,_int,_int>_> *local_618;
  __tuple_element_t<0UL,_tuple<int,_int,_int>_> *local_610;
  undefined1 *local_608;
  undefined1 local_5fc [12];
  int *local_5f0;
  int *local_5e0;
  int *local_5d8;
  int *local_5d0;
  int *local_5c8;
  int local_5bc;
  vector<int,_std::allocator<int>_> local_5b8;
  BendStamp *local_5a0;
  ulong local_598;
  _Rb_tree_const_iterator<std::tuple<int,_int,_int>_> local_590 [7];
  undefined1 local_551;
  string local_530 [32];
  string local_510 [36];
  int local_4ec;
  int *local_4e8;
  int *local_4e0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_4d8;
  undefined4 local_4cc;
  vector<int,_std::allocator<int>_> local_4c8 [2];
  BendStamp *local_498;
  ulong local_490;
  undefined1 local_481;
  string local_460 [39];
  undefined1 local_439;
  string local_418 [39];
  undefined1 local_3f1;
  string local_3d0 [39];
  undefined1 local_3a9;
  string local_388 [32];
  int *local_368;
  int *local_360;
  int *local_358;
  int *local_350;
  ulong local_348;
  undefined1 local_339;
  string local_318 [39];
  undefined1 local_2f1;
  string local_2d0 [32];
  string local_2b0 [39];
  undefined1 local_289;
  string local_268 [32];
  string local_248 [32];
  int *local_228;
  int *local_220;
  undefined4 local_218;
  int *local_208;
  int *local_200;
  int *local_1f8;
  long local_1f0;
  int *local_1d0;
  int *local_1c8;
  int *local_1c0;
  vector<int,_std::allocator<int>_> local_1b8;
  BendStamp *local_1a0;
  ulong local_188;
  ostringstream local_180 [384];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  local_188 = 0;
  do {
    uVar1 = local_188;
    sVar4 = getNBends((FragmentStamp *)0x29f7c5);
    if (sVar4 <= uVar1) {
      local_490 = 0;
      do {
        uVar1 = local_490;
        sVar4 = getNBends((FragmentStamp *)0x2a07af);
        if (sVar4 <= uVar1) {
          std::
          set<std::tuple<int,_int,_int>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
          ::set((set<std::tuple<int,_int,_int>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
                 *)0x2a0c1b);
          std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::_Rb_tree_const_iterator
                    (local_590);
          local_598 = 0;
          while( true ) {
            uVar1 = local_598;
            sVar4 = getNBends((FragmentStamp *)0x2a0c51);
            if (sVar4 <= uVar1) {
              std::
              set<std::tuple<int,_int,_int>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
              ::~set((set<std::tuple<int,_int,_int>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
                      *)0x2a1181);
              std::__cxx11::ostringstream::~ostringstream(local_180);
              return;
            }
            local_5a0 = getBendStamp((FragmentStamp *)in_stack_fffffffffffff6f0._M_node,
                                     in_stack_fffffffffffff6ec);
            BendStamp::getMembers
                      ((BendStamp *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
            sVar5 = std::vector<int,_std::allocator<int>_>::size(&local_5b8);
            if (sVar5 == 2) {
              local_5bc = BendStamp::getGhostVectorSource((BendStamp *)0x2a0cd7);
              local_5d0 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                           ((vector<int,_std::allocator<int>_> *)
                                            CONCAT44(in_stack_fffffffffffff6ec,
                                                     in_stack_fffffffffffff6e8));
              local_5d8 = (int *)std::vector<int,_std::allocator<int>_>::end
                                           ((vector<int,_std::allocator<int>_> *)
                                            CONCAT44(in_stack_fffffffffffff6ec,
                                                     in_stack_fffffffffffff6e8));
              local_5c8 = (int *)std::
                                 find<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                                           (in_stack_fffffffffffff708,in_stack_fffffffffffff700,
                                            (int *)in_stack_fffffffffffff6f8);
              local_5e0 = (int *)std::vector<int,_std::allocator<int>_>::end
                                           ((vector<int,_std::allocator<int>_> *)
                                            CONCAT44(in_stack_fffffffffffff6ec,
                                                     in_stack_fffffffffffff6e8));
              bVar2 = __gnu_cxx::operator!=
                                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)in_stack_fffffffffffff6f0._M_node,
                                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
              if (bVar2) {
                __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
                __normal_iterator<int*>
                          ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                            *)in_stack_fffffffffffff6f0._M_node,
                           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
                local_5f0 = (int *)std::vector<int,_std::allocator<int>_>::insert
                                             (in_stack_fffffffffffff780,in_stack_fffffffffffff788,
                                              in_stack_fffffffffffff778);
              }
            }
            std::vector<int,_std::allocator<int>_>::operator[](&local_5b8,0);
            std::vector<int,_std::allocator<int>_>::operator[](&local_5b8,1);
            std::vector<int,_std::allocator<int>_>::operator[](&local_5b8,2);
            std::tuple<int,_int,_int>::tuple<int_&,_int_&,_int_&,_true,_true>
                      ((tuple<int,_int,_int> *)in_stack_fffffffffffff700._M_current,
                       (int *)in_stack_fffffffffffff6f8,(int *)in_stack_fffffffffffff6f0._M_node,
                       (int *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
            local_608 = local_5fc;
            local_610 = std::get<0ul,int,int,int>((tuple<int,_int,_int> *)0x2a0e67);
            local_618 = std::get<1ul,int,int,int>((tuple<int,_int,_int> *)0x2a0e7c);
            local_620 = std::get<2ul,int,int,int>((tuple<int,_int,_int> *)0x2a0e91);
            if (*local_620 < *local_610) {
              std::swap<int>(local_610,local_620);
            }
            local_628 = (_Base_ptr)
                        std::
                        set<std::tuple<int,_int,_int>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
                        ::find((set<std::tuple<int,_int,_int>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
                                *)in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0._M_node);
            local_590[0]._M_node = local_628;
            local_630._M_node =
                 (_Base_ptr)
                 std::
                 set<std::tuple<int,_int,_int>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
                 ::end((set<std::tuple<int,_int,_int>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
                        *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
            bVar2 = std::operator!=(local_590,&local_630);
            if (bVar2) break;
            pVar10 = std::
                     set<std::tuple<int,_int,_int>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
                     ::insert((set<std::tuple<int,_int,_int>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
                               *)in_stack_fffffffffffff710._M_current,
                              (value_type *)in_stack_fffffffffffff708._M_current);
            in_stack_fffffffffffff6f0 = pVar10.first._M_node;
            in_stack_fffffffffffff6ec = CONCAT13(pVar10.second,(int3)in_stack_fffffffffffff6ec);
            std::vector<int,_std::allocator<int>_>::~vector
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff700._M_current);
            local_598 = local_598 + 1;
          }
          poVar6 = std::operator<<((ostream *)local_180,"Error in Fragment ");
          getName_abi_cxx11_((FragmentStamp *)
                             CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
          poVar6 = std::operator<<(poVar6,local_650);
          poVar6 = std::operator<<(poVar6,": ");
          poVar6 = std::operator<<(poVar6,"Bend");
          containerToString<std::vector<int,std::allocator<int>>>(in_stack_fffffffffffff898);
          this_01 = (OpenMDException *)std::operator<<(poVar6,local_670);
          std::operator<<((ostream *)this_01," appears multiple times\n");
          std::__cxx11::string::~string(local_670);
          std::__cxx11::string::~string(local_650);
          msg = (string *)__cxa_allocate_exception(0x28);
          std::__cxx11::ostringstream::str();
          OpenMDException::OpenMDException(this_01,msg);
          __cxa_throw(msg,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
        }
        local_498 = getBendStamp((FragmentStamp *)in_stack_fffffffffffff6f0._M_node,
                                 in_stack_fffffffffffff6ec);
        BendStamp::getMembers
                  ((BendStamp *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
        getNRigidBodies((FragmentStamp *)0x2a0824);
        local_4cc = 0;
        std::allocator<int>::allocator((allocator<int> *)0x2a084e);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff710._M_current,
                   (size_type)in_stack_fffffffffffff708._M_current,
                   in_stack_fffffffffffff700._M_current,(allocator_type *)in_stack_fffffffffffff6f8)
        ;
        std::allocator<int>::~allocator((allocator<int> *)0x2a0882);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
        __normal_iterator(&local_4d8);
        local_4e0 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                     ((vector<int,_std::allocator<int>_> *)
                                      CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8))
        ;
        local_4d8._M_current = local_4e0;
        while( true ) {
          local_4e8 = (int *)std::vector<int,_std::allocator<int>_>::end
                                       ((vector<int,_std::allocator<int>_> *)
                                        CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8
                                                ));
          bVar2 = __gnu_cxx::operator!=
                            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             in_stack_fffffffffffff6f0._M_node,
                             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
          if (!bVar2) break;
          piVar8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_4d8);
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1c8),(long)*piVar8);
          local_4ec = *pvVar9;
          if (-1 < local_4ec) {
            pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](local_4c8,(long)local_4ec);
            *pvVar9 = *pvVar9 + 1;
            pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](local_4c8,(long)local_4ec);
            if (2 < *pvVar9) {
              poVar6 = std::operator<<((ostream *)local_180,"Error in Fragment ");
              getName_abi_cxx11_((FragmentStamp *)
                                 CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
              poVar6 = std::operator<<(poVar6,local_510);
              poVar6 = std::operator<<(poVar6,": bend");
              containerToString<std::vector<int,std::allocator<int>>>(in_stack_fffffffffffff898);
              poVar6 = std::operator<<(poVar6,local_530);
              std::operator<<(poVar6,"has three atoms on the same rigid body\n");
              std::__cxx11::string::~string(local_530);
              std::__cxx11::string::~string(local_510);
              local_551 = 1;
              uVar7 = __cxa_allocate_exception(0x28);
              std::__cxx11::ostringstream::str();
              OpenMDException::OpenMDException
                        ((OpenMDException *)in_stack_fffffffffffff700._M_current,
                         in_stack_fffffffffffff6f8);
              local_551 = 0;
              __cxa_throw(uVar7,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
            }
          }
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_4d8);
        }
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff700._M_current);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff700._M_current);
        local_490 = local_490 + 1;
      } while( true );
    }
    local_1a0 = getBendStamp((FragmentStamp *)in_stack_fffffffffffff6f0._M_node,
                             in_stack_fffffffffffff6ec);
    BendStamp::getMembers
              ((BendStamp *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
    local_1c8 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                 ((vector<int,_std::allocator<int>_> *)
                                  CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
    local_1d0 = (int *)std::vector<int,_std::allocator<int>_>::end
                                 ((vector<int,_std::allocator<int>_> *)
                                  CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
    sVar4 = getNAtoms((FragmentStamp *)0x29f86c);
    local_1f0 = sVar4 - 1;
    std::bind<std::greater<int>,std::_Placeholder<1>const&,unsigned_long>
              ((greater<int> *)in_stack_fffffffffffff6f8,
               (_Placeholder<1> *)in_stack_fffffffffffff6f0._M_node,
               (unsigned_long *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
    local_1c0 = (int *)std::
                       find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_Bind<std::greater<int>(std::_Placeholder<1>,unsigned_long)>>
                                 (in_stack_fffffffffffff728,in_stack_fffffffffffff720,
                                  in_stack_fffffffffffff718._M_current);
    local_200 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                 ((vector<int,_std::allocator<int>_> *)
                                  CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
    local_208 = (int *)std::vector<int,_std::allocator<int>_>::end
                                 ((vector<int,_std::allocator<int>_> *)
                                  CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
    local_218 = 0;
    std::bind<std::less<int>,std::_Placeholder<1>const&,int>
              ((less<int> *)in_stack_fffffffffffff6f8,
               (_Placeholder<1> *)in_stack_fffffffffffff6f0._M_node,
               (int *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
    local_1f8 = (int *)std::
                       find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_Bind<std::less<int>(std::_Placeholder<1>,int)>>
                                 (in_stack_fffffffffffff718,in_stack_fffffffffffff710,
                                  in_stack_fffffffffffff708._M_current);
    local_220 = (int *)std::vector<int,_std::allocator<int>_>::end
                                 ((vector<int,_std::allocator<int>_> *)
                                  CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffff6f0._M_node,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
    local_6f1 = true;
    if (!bVar2) {
      local_228 = (int *)std::vector<int,_std::allocator<int>_>::end
                                   ((vector<int,_std::allocator<int>_> *)
                                    CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      local_6f1 = __gnu_cxx::operator!=
                            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             in_stack_fffffffffffff6f0._M_node,
                             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
    }
    if (local_6f1 != false) {
      poVar6 = std::operator<<((ostream *)local_180,"Error in Fragment ");
      getName_abi_cxx11_((FragmentStamp *)
                         CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      poVar6 = std::operator<<(poVar6,local_248);
      poVar6 = std::operator<<(poVar6," : atoms of bend");
      containerToString<std::vector<int,std::allocator<int>>>(in_stack_fffffffffffff898);
      poVar6 = std::operator<<(poVar6,local_268);
      std::operator<<(poVar6," have invalid indices\n");
      std::__cxx11::string::~string(local_268);
      std::__cxx11::string::~string(local_248);
      local_289 = 1;
      uVar7 = __cxa_allocate_exception(0x28);
      std::__cxx11::ostringstream::str();
      OpenMDException::OpenMDException
                ((OpenMDException *)in_stack_fffffffffffff700._M_current,in_stack_fffffffffffff6f8);
      local_289 = 0;
      __cxa_throw(uVar7,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    bVar2 = hasDuplicateElement<std::vector<int,std::allocator<int>>>(in_stack_fffffffffffff790);
    if (bVar2) {
      poVar6 = std::operator<<((ostream *)local_180,"Error in Fragment ");
      getName_abi_cxx11_((FragmentStamp *)
                         CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      poVar6 = std::operator<<(poVar6,local_2b0);
      poVar6 = std::operator<<(poVar6," : atoms of bend");
      containerToString<std::vector<int,std::allocator<int>>>(in_stack_fffffffffffff898);
      poVar6 = std::operator<<(poVar6,local_2d0);
      std::operator<<(poVar6," have duplicated indices\n");
      std::__cxx11::string::~string(local_2d0);
      std::__cxx11::string::~string(local_2b0);
      local_2f1 = 1;
      uVar7 = __cxa_allocate_exception(0x28);
      std::__cxx11::ostringstream::str();
      OpenMDException::OpenMDException
                ((OpenMDException *)in_stack_fffffffffffff700._M_current,in_stack_fffffffffffff6f8);
      local_2f1 = 0;
      __cxa_throw(uVar7,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    sVar5 = std::vector<int,_std::allocator<int>_>::size(&local_1b8);
    if (sVar5 == 2) {
      bVar2 = BendStamp::haveGhostVectorSource((BendStamp *)0x29fe43);
      if (!bVar2) {
        poVar6 = std::operator<<((ostream *)local_180,"Error in Fragment ");
        getName_abi_cxx11_((FragmentStamp *)
                           CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
        poVar6 = std::operator<<(poVar6,local_318);
        std::operator<<(poVar6,": ghostVectorSouce is missing\n");
        std::__cxx11::string::~string(local_318);
        local_339 = 1;
        uVar7 = __cxa_allocate_exception(0x28);
        std::__cxx11::ostringstream::str();
        OpenMDException::OpenMDException
                  ((OpenMDException *)in_stack_fffffffffffff700._M_current,in_stack_fffffffffffff6f8
                  );
        local_339 = 0;
        __cxa_throw(uVar7,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      iVar3 = BendStamp::getGhostVectorSource((BendStamp *)0x29ffcc);
      local_348 = (long)iVar3;
      sVar4 = getNAtoms((FragmentStamp *)0x2a0003);
      if (sVar4 <= (ulong)(long)iVar3) {
        poVar6 = std::operator<<((ostream *)local_180,"Error in Fragment ");
        getName_abi_cxx11_((FragmentStamp *)
                           CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
        poVar6 = std::operator<<(poVar6,local_418);
        poVar6 = std::operator<<(poVar6,": ghostVectorSource ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_348);
        std::operator<<(poVar6,"  is invalid\n");
        std::__cxx11::string::~string(local_418);
        local_439 = 1;
        uVar7 = __cxa_allocate_exception(0x28);
        std::__cxx11::ostringstream::str();
        OpenMDException::OpenMDException
                  ((OpenMDException *)in_stack_fffffffffffff700._M_current,in_stack_fffffffffffff6f8
                  );
        local_439 = 0;
        __cxa_throw(uVar7,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      local_358 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                   ((vector<int,_std::allocator<int>_> *)
                                    CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      local_360 = (int *)std::vector<int,_std::allocator<int>_>::end
                                   ((vector<int,_std::allocator<int>_> *)
                                    CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      local_350 = (int *)std::
                         find<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,unsigned_long>
                                   (in_stack_fffffffffffff708,in_stack_fffffffffffff700,
                                    (unsigned_long *)in_stack_fffffffffffff6f8);
      local_368 = (int *)std::vector<int,_std::allocator<int>_>::end
                                   ((vector<int,_std::allocator<int>_> *)
                                    CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      bVar2 = __gnu_cxx::operator==
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffff6f0._M_node,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      if (bVar2) {
        poVar6 = std::operator<<((ostream *)local_180,"Error in Fragment ");
        getName_abi_cxx11_((FragmentStamp *)
                           CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
        poVar6 = std::operator<<(poVar6,local_388);
        poVar6 = std::operator<<(poVar6,": ghostVectorSouce ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_348);
        std::operator<<(poVar6,"is invalid\n");
        std::__cxx11::string::~string(local_388);
        local_3a9 = 1;
        uVar7 = __cxa_allocate_exception(0x28);
        std::__cxx11::ostringstream::str();
        OpenMDException::OpenMDException
                  ((OpenMDException *)in_stack_fffffffffffff700._M_current,in_stack_fffffffffffff6f8
                  );
        local_3a9 = 0;
        __cxa_throw(uVar7,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      this_00 = getAtomStamp((FragmentStamp *)in_stack_fffffffffffff6f0._M_node,
                             in_stack_fffffffffffff6ec);
      bVar2 = AtomStamp::haveOrientation(this_00);
      if (!bVar2) {
        poVar6 = std::operator<<((ostream *)local_180,"Error in Fragment ");
        getName_abi_cxx11_((FragmentStamp *)
                           CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
        poVar6 = std::operator<<(poVar6,local_3d0);
        std::operator<<(poVar6,": ghost atom must be a directional atom\n");
        std::__cxx11::string::~string(local_3d0);
        local_3f1 = 1;
        uVar7 = __cxa_allocate_exception(0x28);
        std::__cxx11::ostringstream::str();
        OpenMDException::OpenMDException
                  ((OpenMDException *)in_stack_fffffffffffff700._M_current,in_stack_fffffffffffff6f8
                  );
        local_3f1 = 0;
        __cxa_throw(uVar7,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
    }
    else {
      sVar5 = std::vector<int,_std::allocator<int>_>::size(&local_1b8);
      if ((sVar5 == 3) && (bVar2 = BendStamp::haveGhostVectorSource((BendStamp *)0x2a05d7), bVar2))
      {
        poVar6 = std::operator<<((ostream *)local_180,"Error in Fragment ");
        getName_abi_cxx11_((FragmentStamp *)
                           CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
        poVar6 = std::operator<<(poVar6,local_460);
        std::operator<<(poVar6,": normal bend should not have ghostVectorSouce\n");
        std::__cxx11::string::~string(local_460);
        local_481 = 1;
        uVar7 = __cxa_allocate_exception(0x28);
        std::__cxx11::ostringstream::str();
        OpenMDException::OpenMDException
                  ((OpenMDException *)in_stack_fffffffffffff700._M_current,in_stack_fffffffffffff6f8
                  );
        local_481 = 0;
        __cxa_throw(uVar7,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
    }
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff700._M_current);
    local_188 = local_188 + 1;
  } while( true );
}

Assistant:

void FragmentStamp::checkBends() {
    std::ostringstream oss;
    for (std::size_t i = 0; i < getNBends(); ++i) {
      BendStamp* bendStamp         = getBendStamp(i);
      std::vector<int> bendAtoms   = bendStamp->getMembers();
      std::vector<int>::iterator j = std::find_if(
          bendAtoms.begin(), bendAtoms.end(),
          std::bind(std::greater<int>(), placeholders::_1, getNAtoms() - 1));
      std::vector<int>::iterator k =
          std::find_if(bendAtoms.begin(), bendAtoms.end(),
                       std::bind(std::less<int>(), placeholders::_1, 0));

      if (j != bendAtoms.end() || k != bendAtoms.end()) {
        oss << "Error in Fragment " << getName() << " : atoms of bend"
            << containerToString(bendAtoms) << " have invalid indices\n";
        throw OpenMDException(oss.str());
      }

      if (hasDuplicateElement(bendAtoms)) {
        oss << "Error in Fragment " << getName() << " : atoms of bend"
            << containerToString(bendAtoms) << " have duplicated indices\n";
        throw OpenMDException(oss.str());
      }

      if (bendAtoms.size() == 2) {
        if (!bendStamp->haveGhostVectorSource()) {
          oss << "Error in Fragment " << getName()
              << ": ghostVectorSouce is missing\n";
          throw OpenMDException(oss.str());
        } else {
          std::size_t ghostIndex = bendStamp->getGhostVectorSource();
          if (ghostIndex < getNAtoms()) {
            if (std::find(bendAtoms.begin(), bendAtoms.end(), ghostIndex) ==
                bendAtoms.end()) {
              oss << "Error in Fragment " << getName() << ": ghostVectorSouce "
                  << ghostIndex << "is invalid\n";
              throw OpenMDException(oss.str());
            }
            if (!getAtomStamp(ghostIndex)->haveOrientation()) {
              oss << "Error in Fragment " << getName()
                  << ": ghost atom must be a directional atom\n";
              throw OpenMDException(oss.str());
            }
          } else {
            oss << "Error in Fragment " << getName() << ": ghostVectorSource "
                << ghostIndex << "  is invalid\n";
            throw OpenMDException(oss.str());
          }
        }
      } else if (bendAtoms.size() == 3 && bendStamp->haveGhostVectorSource()) {
        oss << "Error in Fragment " << getName()
            << ": normal bend should not have ghostVectorSouce\n";
        throw OpenMDException(oss.str());
      }
    }

    for (std::size_t i = 0; i < getNBends(); ++i) {
      BendStamp* bendStamp       = getBendStamp(i);
      std::vector<int> bendAtoms = bendStamp->getMembers();
      std::vector<int> rigidSet(getNRigidBodies(), 0);
      std::vector<int>::iterator j;
      for (j = bendAtoms.begin(); j != bendAtoms.end(); ++j) {
        int rigidbodyIndex = atom2Rigidbody[*j];
        if (rigidbodyIndex >= 0) {
          ++rigidSet[rigidbodyIndex];
          if (rigidSet[rigidbodyIndex] > 2) {
            oss << "Error in Fragment " << getName() << ": bend"
                << containerToString(bendAtoms)
                << "has three atoms on the same rigid body\n";
            throw OpenMDException(oss.str());
          }
        }
      }
    }

    std::set<std::tuple<int, int, int>> allBends;
    std::set<std::tuple<int, int, int>>::iterator iter;
    for (std::size_t i = 0; i < getNBends(); ++i) {
      BendStamp* bendStamp  = getBendStamp(i);
      std::vector<int> bend = bendStamp->getMembers();
      if (bend.size() == 2) {
        // in case we have two ghost bend. For example,
        // bend {
        // members (0, 1);
        //   ghostVectorSource = 0;
        // }
        // and
        // bend {
        //   members (0, 1);
        // ghostVectorSource = 0;
        // }
        // In order to distinguish them. we expand them to Tuple3.
        // the first one is expanded to (0, 0, 1) while the second one
        // is expaned to (0, 1, 1)
        int ghostIndex = bendStamp->getGhostVectorSource();
        std::vector<int>::iterator j =
            std::find(bend.begin(), bend.end(), ghostIndex);
        if (j != bend.end()) { bend.insert(j, ghostIndex); }
      }

      std::tuple<int, int, int> bendTuple {bend[0], bend[1], bend[2]};
      auto& [first, second, third] = bendTuple;

      // make sure bendTuple.first is always less than or equal to
      // bendTuple.third
      if (first > third) { std::swap(first, third); }

      iter = allBends.find(bendTuple);
      if (iter != allBends.end()) {
        oss << "Error in Fragment " << getName() << ": "
            << "Bend" << containerToString(bend) << " appears multiple times\n";
        throw OpenMDException(oss.str());
      } else {
        allBends.insert(bendTuple);
      }
    }
  }